

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

uint32_t ngx_utf8_decode(u_char **p,size_t n)

{
  byte bVar1;
  uint32_t uVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  pbVar3 = *p;
  bVar1 = *pbVar3;
  if (bVar1 < 0xf0) {
    if (bVar1 < 0xe0) {
      if (bVar1 < 0xc2) {
        *p = pbVar3 + 1;
        return 0xffffffff;
      }
      uVar4 = 0x7f;
      uVar5 = 1;
      uVar6 = 0x1f;
    }
    else {
      uVar4 = 0x7ff;
      uVar5 = 2;
      uVar6 = 0xf;
    }
  }
  else {
    uVar4 = 0xffff;
    uVar5 = 3;
    uVar6 = 7;
  }
  uVar2 = 0xfffffffe;
  if (uVar5 <= n - 1) {
    uVar6 = uVar6 & bVar1;
    *p = pbVar3 + 1;
    pbVar3 = pbVar3 + 2;
    do {
      *p = pbVar3;
      if (-1 < (char)pbVar3[-1]) {
        return 0xffffffff;
      }
      uVar6 = pbVar3[-1] & 0x3f | uVar6 << 6;
      pbVar3 = pbVar3 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar2 = 0xffffffff;
    if (uVar4 < uVar6) {
      uVar2 = uVar6;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
ngx_utf8_decode(u_char **p, size_t n)
{
    size_t    len;
    uint32_t  u, i, valid;

    u = **p;

    if (u >= 0xf0) {

        u &= 0x07;
        valid = 0xffff;
        len = 3;

    } else if (u >= 0xe0) {

        u &= 0x0f;
        valid = 0x7ff;
        len = 2;

    } else if (u >= 0xc2) {

        u &= 0x1f;
        valid = 0x7f;
        len = 1;

    } else {
        (*p)++;
        return 0xffffffff;
    }

    if (n - 1 < len) {
        return 0xfffffffe;
    }

    (*p)++;

    while (len) {
        i = *(*p)++;

        if (i < 0x80) {
            return 0xffffffff;
        }

        u = (u << 6) | (i & 0x3f);

        len--;
    }

    if (u > valid) {
        return u;
    }

    return 0xffffffff;
}